

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::VertexFeedbackCase::iterate(VertexFeedbackCase *this)

{
  ostringstream *poVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  deUint32 dVar5;
  undefined4 extraout_var;
  ulong uVar7;
  TestError *pTVar8;
  int iVar9;
  Enum<int,_2UL> local_1d8;
  undefined4 local_1c8;
  Enum<int,_2UL> local_1c0;
  undefined1 local_1b0 [384];
  long lVar6;
  
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar2);
  uVar7 = (ulong)this->m_output;
  iVar2 = 0;
  iVar9 = 0;
  if (uVar7 < 5) {
    iVar2 = *(int *)(&DAT_0188f944 + uVar7 * 4);
    iVar9 = *(int *)(&DAT_0188f958 + uVar7 * 4);
  }
  iVar3 = (**(code **)(lVar6 + 0x780))((this->m_program->m_program).m_program,"a_position");
  iVar4 = (**(code **)(lVar6 + 0x780))((this->m_program->m_program).m_program,"a_offset");
  if (iVar3 == -1) {
    pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1b0,"a_position location was -1",(allocator<char> *)&local_1d8);
    tcu::TestError::TestError(pTVar8,(string *)local_1b0);
    __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  if (iVar4 == -1) {
    pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1b0,"a_offset location was -1",(allocator<char> *)&local_1d8);
    tcu::TestError::TestError(pTVar8,(string *)local_1b0);
    __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (**(code **)(lVar6 + 0x1680))((this->m_program->m_program).m_program);
  (**(code **)(lVar6 + 0x40))(0x8892,this->m_arrayBuf);
  (**(code **)(lVar6 + 0x19f0))(iVar3,4,0x1406,0,0,0);
  (**(code **)(lVar6 + 0x610))(iVar3);
  (**(code **)(lVar6 + 0x40))(0x8892,this->m_offsetBuf);
  (**(code **)(lVar6 + 0x19f0))(iVar4,4,0x1406,0,0,0);
  (**(code **)(lVar6 + 0x610))(iVar4);
  (**(code **)(lVar6 + 0x48))(0x8c8e,0,this->m_feedbackBuf);
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"bind buffer base",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                  ,0x15e4);
  local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"Calling BeginTransformFeedback(");
  local_1d8.m_getName = glu::getPrimitiveTypeName;
  local_1d8.m_value = iVar9;
  tcu::Format::Enum<int,_2UL>::toStream(&local_1d8,(ostream *)poVar1);
  std::operator<<((ostream *)poVar1,")");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  (**(code **)(lVar6 + 0x30))(iVar9);
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"beginTransformFeedback",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                  ,0x15e8);
  switch(this->m_method) {
  case METHOD_DRAW_ARRAYS:
    local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Calling DrawArrays(");
    local_1d8.m_getName = glu::getPrimitiveTypeName;
    local_1d8.m_value = iVar2;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1d8,(ostream *)poVar1);
    std::operator<<((ostream *)poVar1,", ...)");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    (**(code **)(lVar6 + 0x538))(iVar2,0,4);
    break;
  case METHOD_DRAW_ARRAYS_INSTANCED:
    local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Calling DrawArraysInstanced(");
    local_1d8.m_getName = glu::getPrimitiveTypeName;
    local_1d8.m_value = iVar2;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1d8,(ostream *)poVar1);
    std::operator<<((ostream *)poVar1,", ...)");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    (**(code **)(lVar6 + 0x18a0))(iVar4,2);
    (**(code **)(lVar6 + 0x548))(iVar2,0,3,2);
    break;
  case METHOD_DRAW_ARRAYS_INDIRECT:
    local_1d8.m_getName = (GetNameFunc)0x100000004;
    local_1d8.m_value = 0;
    local_1d8._12_4_ = 0;
    (**(code **)(lVar6 + 0x6c8))(1,&this->m_indirectBuffer);
    (**(code **)(lVar6 + 0x40))(0x8f3f,this->m_indirectBuffer);
    (**(code **)(lVar6 + 0x150))(0x8f3f,0x10,&local_1d8,0x88e4);
    local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Calling DrawElementsIndirect(");
    local_1c0.m_getName = glu::getPrimitiveTypeName;
    local_1c0.m_value = iVar2;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1c0,(ostream *)poVar1);
    std::operator<<((ostream *)poVar1,", ...)");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    (**(code **)(lVar6 + 0x540))(iVar2,0);
    break;
  case METHOD_DRAW_ELEMENTS:
    local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Calling DrawElements(");
    local_1d8.m_getName = glu::getPrimitiveTypeName;
    local_1d8.m_value = iVar2;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1d8,(ostream *)poVar1);
    std::operator<<((ostream *)poVar1,", ...)");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    (**(code **)(lVar6 + 0x568))(iVar2,4,0x1403,0);
    break;
  case METHOD_DRAW_ELEMENTS_INSTANCED:
    local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Calling DrawElementsInstanced(");
    local_1d8.m_getName = glu::getPrimitiveTypeName;
    local_1d8.m_value = iVar2;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1d8,(ostream *)poVar1);
    std::operator<<((ostream *)poVar1,", ...)");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    (**(code **)(lVar6 + 0x580))(iVar2,3,0x1403,0,2);
    break;
  case METHOD_DRAW_ELEMENTS_INDIRECT:
    local_1d8.m_getName = (GetNameFunc)0x100000004;
    local_1d8.m_value = 0;
    local_1d8._12_4_ = 0;
    local_1c8 = 0;
    (**(code **)(lVar6 + 0x6c8))(1,&this->m_indirectBuffer);
    (**(code **)(lVar6 + 0x40))(0x8f3f,this->m_indirectBuffer);
    (**(code **)(lVar6 + 0x150))(0x8f3f,0x14,&local_1d8,0x88e4);
    local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Calling DrawElementsIndirect(");
    local_1c0.m_getName = glu::getPrimitiveTypeName;
    local_1c0.m_value = iVar2;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1c0,(ostream *)poVar1);
    std::operator<<((ostream *)poVar1,", ...)");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    (**(code **)(lVar6 + 0x578))(iVar2,0x1403,0);
  }
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"draw",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                  ,0x1642);
  (**(code **)(lVar6 + 0x638))();
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"endTransformFeedback",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                  ,0x1645);
  local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"No errors.");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  return STOP;
}

Assistant:

VertexFeedbackCase::IterateResult VertexFeedbackCase::iterate (void)
{
	const glw::Functions&	gl				= m_context.getRenderContext().getFunctions();
	const deUint32			outputPrimitive	= getOutputPrimitive();
	const deUint32			basePrimitive	= getBasePrimitive();

	const int				posLocation		= gl.getAttribLocation(m_program->getProgram(), "a_position");
	const int				offsetLocation	= gl.getAttribLocation(m_program->getProgram(), "a_offset");

	if (posLocation == -1)
		throw tcu::TestError("a_position location was -1");
	if (offsetLocation == -1)
		throw tcu::TestError("a_offset location was -1");

	gl.useProgram(m_program->getProgram());

	gl.bindBuffer(GL_ARRAY_BUFFER, m_arrayBuf);
	gl.vertexAttribPointer(posLocation, 4, GL_FLOAT, GL_FALSE, 0, DE_NULL);
	gl.enableVertexAttribArray(posLocation);

	gl.bindBuffer(GL_ARRAY_BUFFER, m_offsetBuf);
	gl.vertexAttribPointer(offsetLocation, 4, GL_FLOAT, GL_FALSE, 0, DE_NULL);
	gl.enableVertexAttribArray(offsetLocation);

	gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0, m_feedbackBuf);
	GLU_EXPECT_NO_ERROR(gl.getError(), "bind buffer base");

	m_testCtx.getLog() << tcu::TestLog::Message << "Calling BeginTransformFeedback(" << glu::getPrimitiveTypeStr(basePrimitive) << ")" << tcu::TestLog::EndMessage;
	gl.beginTransformFeedback(basePrimitive);
	GLU_EXPECT_NO_ERROR(gl.getError(), "beginTransformFeedback");

	switch (m_method)
	{
		case METHOD_DRAW_ARRAYS:
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Calling DrawArrays(" << glu::getPrimitiveTypeStr(outputPrimitive) << ", ...)" << tcu::TestLog::EndMessage;
			gl.drawArrays(outputPrimitive, 0, 4);
			break;
		}

		case METHOD_DRAW_ARRAYS_INSTANCED:
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Calling DrawArraysInstanced(" << glu::getPrimitiveTypeStr(outputPrimitive) << ", ...)" << tcu::TestLog::EndMessage;
			gl.vertexAttribDivisor(offsetLocation, 2);
			gl.drawArraysInstanced(outputPrimitive, 0, 3, 2);
			break;
		}

		case METHOD_DRAW_ELEMENTS:
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Calling DrawElements(" << glu::getPrimitiveTypeStr(outputPrimitive) << ", ...)" << tcu::TestLog::EndMessage;
			gl.drawElements(outputPrimitive, 4, GL_UNSIGNED_SHORT, DE_NULL);
			break;
		}

		case METHOD_DRAW_ELEMENTS_INSTANCED:
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Calling DrawElementsInstanced(" << glu::getPrimitiveTypeStr(outputPrimitive) << ", ...)" << tcu::TestLog::EndMessage;
			gl.drawElementsInstanced(outputPrimitive, 3, GL_UNSIGNED_SHORT, DE_NULL, 2);
			break;
		}

		case METHOD_DRAW_ARRAYS_INDIRECT:
		{
			struct DrawArraysIndirectCommand
			{
				deUint32 count;
				deUint32 instanceCount;
				deUint32 first;
				deUint32 reservedMustBeZero;
			} params;

			DE_STATIC_ASSERT(sizeof(DrawArraysIndirectCommand) == sizeof(deUint32[4]));

			params.count = 4;
			params.instanceCount = 1;
			params.first = 0;
			params.reservedMustBeZero = 0;

			gl.genBuffers(1, &m_indirectBuffer);
			gl.bindBuffer(GL_DRAW_INDIRECT_BUFFER, m_indirectBuffer);
			gl.bufferData(GL_DRAW_INDIRECT_BUFFER, sizeof(params), &params, GL_STATIC_DRAW);

			m_testCtx.getLog() << tcu::TestLog::Message << "Calling DrawElementsIndirect(" << glu::getPrimitiveTypeStr(outputPrimitive) << ", ...)" << tcu::TestLog::EndMessage;
			gl.drawArraysIndirect(outputPrimitive, DE_NULL);
			break;
		}

		case METHOD_DRAW_ELEMENTS_INDIRECT:
		{
			struct DrawElementsIndirectCommand
			{
				deUint32	count;
				deUint32	instanceCount;
				deUint32	firstIndex;
				deInt32		baseVertex;
				deUint32	reservedMustBeZero;
			} params;

			DE_STATIC_ASSERT(sizeof(DrawElementsIndirectCommand) == sizeof(deUint32[5]));

			params.count = 4;
			params.instanceCount = 1;
			params.firstIndex = 0;
			params.baseVertex = 0;
			params.reservedMustBeZero = 0;

			gl.genBuffers(1, &m_indirectBuffer);
			gl.bindBuffer(GL_DRAW_INDIRECT_BUFFER, m_indirectBuffer);
			gl.bufferData(GL_DRAW_INDIRECT_BUFFER, sizeof(params), &params, GL_STATIC_DRAW);

			m_testCtx.getLog() << tcu::TestLog::Message << "Calling DrawElementsIndirect(" << glu::getPrimitiveTypeStr(outputPrimitive) << ", ...)" << tcu::TestLog::EndMessage;
			gl.drawElementsIndirect(outputPrimitive, GL_UNSIGNED_SHORT, DE_NULL);
			break;
		}

		default:
			DE_ASSERT(false);
	}
	GLU_EXPECT_NO_ERROR(gl.getError(), "draw");

	gl.endTransformFeedback();
	GLU_EXPECT_NO_ERROR(gl.getError(), "endTransformFeedback");

	m_testCtx.getLog() << tcu::TestLog::Message << "No errors." << tcu::TestLog::EndMessage;
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	return STOP;
}